

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GLTexureUpload1D(AGLTexture *tex,AGLTextureData *data,GLenum binding,A__GLTextureFormat tf)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  void *local_58;
  void *to_upload;
  int is_subimage;
  int expand;
  int maxwidth;
  GLenum binding_local;
  AGLTextureData *data_local;
  AGLTexture *tex_local;
  GLenum GStack_10;
  A__GLTextureFormat tf_local;
  
  iVar3 = data->x + data->width;
  iVar1 = tex->width;
  bVar2 = 0 < data->x;
  if ((bVar2) || (data->pixels == (void *)0x0)) {
    local_58 = (void *)0x0;
  }
  else {
    local_58 = data->pixels;
  }
  if (binding != 0xde0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3e4,"binding == GL_TEXTURE_1D");
    aAppTerminate(-1);
  }
  GStack_10 = tf.format;
  if ((iVar1 < iVar3) || (local_58 != (void *)0x0)) {
    glTexImage1D(binding,0,tf._0_8_ & 0xffffffff,iVar3,0,GStack_10,tf.type,local_58);
    tex->width = iVar3;
  }
  if (bVar2) {
    if (data->pixels == (void *)0x0) {
      aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                      ,0x3ed,"data->pixels");
      aAppTerminate(-1);
    }
    glTexSubImage1D(binding,0,data->x,data->width,GStack_10,tf.type,data->pixels);
  }
  return;
}

Assistant:

static void a__GLTexureUpload1D(AGLTexture *tex, const AGLTextureData *data, GLenum binding, struct A__GLTextureFormat tf) {
	const int maxwidth = data->x + data->width;

	const int expand = maxwidth > tex->width;
	const int is_subimage = data->x > 0;
	const void *const to_upload = (!is_subimage && data->pixels) ? data->pixels : NULL;

	ATTO_ASSERT(binding == GL_TEXTURE_1D);

	if (expand || to_upload) {
		AGL__CALL(glTexImage1D(binding, 0, tf.internal, maxwidth, 0,
			tf.format, tf.type, to_upload));
		tex->width = maxwidth;
	}

	if (is_subimage) {
		ATTO_ASSERT(data->pixels);
		AGL__CALL(glTexSubImage1D(binding, 0,
			data->x, data->width,
			tf.format, tf.type, data->pixels));
	}
}